

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O2

char * ucharstrenum_next(UEnumeration *en,int32_t *resultLength,UErrorCode *param_3)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  char *__s;
  
  iVar1 = *(int *)&en[1].baseContext;
  if (iVar1 < *(int *)((long)&en[1].baseContext + 4)) {
    pvVar2 = en->context;
    *(int *)&en[1].baseContext = iVar1 + 1;
    __s = *(char **)((long)pvVar2 + (long)iVar1 * 8);
    if (resultLength != (int32_t *)0x0) {
      sVar3 = strlen(__s);
      *resultLength = (int32_t)sVar3;
    }
  }
  else {
    __s = (char *)0x0;
  }
  return __s;
}

Assistant:

static const char* U_CALLCONV
ucharstrenum_next(UEnumeration* en,
                  int32_t* resultLength,
                  UErrorCode* /*ec*/) {
    UCharStringEnumeration *e = (UCharStringEnumeration*) en;
    if (e->index >= e->count) {
        return NULL;
    }
    const char* result = ((const char**)e->uenum.context)[e->index++];
    if (resultLength) {
        *resultLength = (int32_t)uprv_strlen(result);
    }
    return result;
}